

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitResume(InternalAnalyzer *this,Resume *curr)

{
  bool bVar1;
  Resume *curr_local;
  InternalAnalyzer *this_local;
  
  this->parent->calls = true;
  this->parent->implicitTrap = true;
  bVar1 = FeatureSet::hasExceptionHandling(&this->parent->features);
  if ((bVar1) && (this->parent->tryDepth == 0)) {
    this->parent->throws_ = true;
  }
  return;
}

Assistant:

void visitResume(Resume* curr) {
      // This acts as a kitchen sink effect.
      parent.calls = true;

      // resume instructions accept nullable continuation references and trap
      // on null.
      parent.implicitTrap = true;

      if (parent.features.hasExceptionHandling() && parent.tryDepth == 0) {
        parent.throws_ = true;
      }
    }